

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# f_generic.c
# Opt level: O0

mask_t gf_eq(gf_s *a,gf_s *b)

{
  uint64_t uVar1;
  gf_s *in_RSI;
  gf_s *in_RDI;
  uint i;
  mask_t ret;
  gf c;
  uint local_64;
  gf_s local_58;
  
  gf_sub(&local_58,in_RDI,in_RSI);
  gf_strong_reduce(&local_58);
  for (local_64 = 0; local_64 < 8; local_64 = local_64 + 1) {
  }
  uVar1 = constant_time_is_zero_64(0x3c4fd1);
  return uVar1;
}

Assistant:

mask_t gf_eq(const gf a, const gf b)
{
    gf c;
    mask_t ret = 0;
    unsigned int i;

    gf_sub(c, a, b);
    gf_strong_reduce(c);

    for (i = 0; i < NLIMBS; i++)
        ret |= c->limb[LIMBPERM(i)];

    return word_is_zero(ret);
}